

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall
perfetto::protos::gen::ObserveEventsRequest::ParseFromArray
          (ObserveEventsRequest *this,void *raw,size_t size)

{
  byte bVar1;
  pointer pOVar2;
  iterator __position;
  bool bVar3;
  ObservableEvents_Type OVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong *puVar8;
  uint8_t cur_byte_1;
  ObservableEvents_Type *pOVar9;
  ulong uVar10;
  ulong *puVar11;
  uint uVar12;
  uint8_t cur_byte_2;
  ulong *puVar13;
  ulong uVar14;
  uint8_t cur_byte;
  ulong *puVar15;
  Field local_48;
  vector<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>
  *local_38;
  
  pOVar2 = (this->events_to_observe_).
           super__Vector_base<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->events_to_observe_).
      super__Vector_base<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>
      ._M_impl.super__Vector_impl_data._M_finish != pOVar2) {
    (this->events_to_observe_).
    super__Vector_base<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>
    ._M_impl.super__Vector_impl_data._M_finish = pOVar2;
  }
  local_38 = &this->events_to_observe_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar8 = (ulong *)(size + (long)raw);
  local_48.int_value_ = 0;
LAB_0024c4f8:
  if (puVar8 <= raw) goto switchD_0024c546_caseD_3;
  bVar1 = (byte)*raw;
  uVar10 = (ulong)bVar1;
  puVar13 = (ulong *)((long)raw + 1);
  if ((char)bVar1 < '\0') {
    uVar10 = (ulong)(bVar1 & 0x7f);
    lVar6 = 7;
    do {
      if ((puVar8 <= puVar13) || (0x38 < lVar6 - 7U)) goto switchD_0024c546_caseD_3;
      uVar14 = *puVar13;
      puVar13 = (ulong *)((long)puVar13 + 1);
      uVar10 = uVar10 | (ulong)((byte)uVar14 & 0x7f) << ((byte)lVar6 & 0x3f);
      lVar6 = lVar6 + 7;
    } while ((char)(byte)uVar14 < '\0');
  }
  uVar12 = (uint)(uVar10 >> 3);
  if ((uVar12 == 0) || (puVar8 <= puVar13)) goto switchD_0024c546_caseD_3;
  switch((uint)uVar10 & 7) {
  case 0:
    uVar14 = 0;
    uVar5 = 0;
    while( true ) {
      puVar15 = (ulong *)((long)puVar13 + 1);
      uVar14 = (ulong)((byte)*puVar13 & 0x7f) << ((byte)uVar5 & 0x3f) | uVar14;
      if (-1 < (char)(byte)*puVar13) break;
      if ((puVar8 <= puVar15) || (bVar3 = 0x38 < uVar5, uVar5 = uVar5 + 7, puVar13 = puVar15, bVar3)
         ) goto switchD_0024c546_caseD_3;
    }
    uVar5 = uVar14 & 0xffffffff00000000;
LAB_0024c61b:
    uVar7 = 0;
LAB_0024c61d:
    raw = puVar15;
    if ((uVar12 < 0x10000) && (uVar7 < 0x10000000)) {
      local_48.int_value_ = uVar5 | uVar14 & 0xffffffff;
      uVar10 = uVar7 | (uVar10 >> 3) << 0x20 | (uVar10 & 7) << 0x30;
LAB_0024c6ca:
      OVar4 = (ObservableEvents_Type)local_48.int_value_;
      local_48.size_ = (uint32_t)uVar10;
      local_48.type_ = (uint8_t)(uVar10 >> 0x30);
      local_48.id_ = (uint16_t)(uVar10 >> 0x20);
      puVar13 = puVar15;
      if (local_48.id_ == 1) {
        *(byte *)&(this->_has_field_).super__Base_bitset<1UL>._M_w =
             (byte)(this->_has_field_).super__Base_bitset<1UL>._M_w | 2;
        __position._M_current =
             (this->events_to_observe_).
             super__Vector_base<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->events_to_observe_).
            super__Vector_base<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>
          ::_M_realloc_insert<>(local_38,__position);
          pOVar9 = (this->events_to_observe_).
                   super__Vector_base<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          OVar4 = (ObservableEvents_Type)local_48.int_value_;
        }
        else {
          *__position._M_current = ObservableEvents_Type_TYPE_UNSPECIFIED;
          pOVar9 = __position._M_current + 1;
          (this->events_to_observe_).
          super__Vector_base<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>
          ._M_impl.super__Vector_impl_data._M_finish = pOVar9;
        }
        pOVar9[-1] = OVar4;
      }
      else {
        if ((uVar10 & 0xffff00000000) == 0) {
          return puVar8 == puVar15;
        }
        protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>
                  (&local_48,&this->unknown_fields_);
      }
LAB_0024c79b:
      if (puVar8 <= puVar13) goto switchD_0024c7e3_caseD_3;
      bVar1 = (byte)*puVar13;
      uVar10 = (ulong)(uint)bVar1;
      puVar11 = (ulong *)((long)puVar13 + 1);
      if ((char)bVar1 < '\0') {
        uVar10 = (ulong)(bVar1 & 0x7f);
        lVar6 = 7;
        do {
          if ((puVar8 <= puVar11) || (0x38 < lVar6 - 7U)) goto switchD_0024c7e3_caseD_3;
          uVar14 = *puVar11;
          puVar11 = (ulong *)((long)puVar11 + 1);
          uVar10 = uVar10 | (ulong)((byte)uVar14 & 0x7f) << ((byte)lVar6 & 0x3f);
          lVar6 = lVar6 + 7;
        } while ((char)(byte)uVar14 < '\0');
      }
      uVar12 = (uint)(uVar10 >> 3);
      if ((uVar12 == 0) || (puVar8 <= puVar11)) goto switchD_0024c7e3_caseD_3;
      switch((uint)uVar10 & 7) {
      case 0:
        uVar14 = 0;
        uVar5 = 0;
        while( true ) {
          puVar15 = (ulong *)((long)puVar11 + 1);
          uVar14 = (ulong)((byte)*puVar11 & 0x7f) << ((byte)uVar5 & 0x3f) | uVar14;
          if (-1 < (char)(byte)*puVar11) break;
          if ((puVar8 <= puVar15) ||
             (bVar3 = 0x38 < uVar5, uVar5 = uVar5 + 7, puVar11 = puVar15, bVar3))
          goto switchD_0024c7e3_caseD_3;
        }
        local_48.int_value_ = uVar14 & 0xffffffff00000000;
LAB_0024c8b4:
        uVar5 = 0;
LAB_0024c8b6:
        puVar13 = puVar15;
        if ((0xffff < uVar12) || (0xfffffff < uVar5)) goto LAB_0024c79b;
        local_48.int_value_ = local_48.int_value_ | uVar14 & 0xffffffff;
        uVar10 = uVar5 | (uVar10 >> 3) << 0x20 | (uVar10 & 7) << 0x30;
        goto LAB_0024c6ca;
      case 1:
        puVar15 = puVar11 + 1;
        if (puVar15 <= puVar8) {
          uVar14 = *puVar11;
          local_48.int_value_ = uVar14 & 0xffffffff00000000;
          goto LAB_0024c8b4;
        }
        break;
      case 2:
        puVar11 = (ulong *)((long)puVar11 + 1);
        uVar5 = 0;
        uVar14 = 0;
        puVar15 = puVar11;
        while (uVar5 = (ulong)(*(byte *)((long)puVar15 + -1) & 0x7f) << ((byte)uVar14 & 0x3f) |
                       uVar5, (char)*(byte *)((long)puVar15 + -1) < '\0') {
          if (puVar8 <= puVar15) goto switchD_0024c7e3_caseD_3;
          puVar15 = (ulong *)((long)puVar15 + 1);
          puVar11 = (ulong *)((long)puVar11 + 1);
          bVar3 = 0x38 < uVar14;
          uVar14 = uVar14 + 7;
          if (bVar3) goto switchD_0024c7e3_caseD_3;
        }
        if (uVar5 <= (ulong)((long)puVar8 - (long)puVar11)) {
          local_48.int_value_ = (ulong)puVar11 & 0xffffffff00000000;
          puVar15 = (ulong *)((long)puVar15 + uVar5);
          uVar14 = (ulong)puVar11 & 0xffffffff;
          goto LAB_0024c8b6;
        }
        break;
      case 5:
        puVar15 = (ulong *)((long)puVar11 + 4);
        if (puVar15 <= puVar8) {
          uVar14 = (ulong)(uint)*puVar11;
          local_48.int_value_ = 0;
          goto LAB_0024c8b4;
        }
      }
switchD_0024c7e3_caseD_3:
      local_48.int_value_ = 0;
      uVar10 = 0;
      puVar15 = puVar13;
      goto LAB_0024c6ca;
    }
    goto LAB_0024c4f8;
  case 1:
    puVar15 = puVar13 + 1;
    if (puVar15 <= puVar8) {
      uVar14 = *puVar13;
      uVar5 = uVar14 & 0xffffffff00000000;
      goto LAB_0024c61b;
    }
    break;
  case 2:
    puVar13 = (ulong *)((long)puVar13 + 1);
    uVar7 = 0;
    uVar14 = 0;
    puVar15 = puVar13;
    while (uVar7 = (ulong)(*(byte *)((long)puVar15 + -1) & 0x7f) << ((byte)uVar14 & 0x3f) | uVar7,
          (char)*(byte *)((long)puVar15 + -1) < '\0') {
      if (puVar8 <= puVar15) goto switchD_0024c546_caseD_3;
      puVar15 = (ulong *)((long)puVar15 + 1);
      puVar13 = (ulong *)((long)puVar13 + 1);
      bVar3 = 0x38 < uVar14;
      uVar14 = uVar14 + 7;
      if (bVar3) goto switchD_0024c546_caseD_3;
    }
    if (uVar7 <= (ulong)((long)puVar8 - (long)puVar13)) {
      uVar5 = (ulong)puVar13 & 0xffffffff00000000;
      puVar15 = (ulong *)((long)puVar15 + uVar7);
      uVar14 = (ulong)puVar13 & 0xffffffff;
      goto LAB_0024c61d;
    }
    break;
  case 5:
    puVar15 = (ulong *)((long)puVar13 + 4);
    if (puVar15 <= puVar8) {
      uVar14 = (ulong)(uint)*puVar13;
      uVar5 = 0;
      goto LAB_0024c61b;
    }
  }
switchD_0024c546_caseD_3:
  uVar10 = 0;
  puVar15 = (ulong *)raw;
  goto LAB_0024c6ca;
}

Assistant:

bool ObserveEventsRequest::ParseFromArray(const void* raw, size_t size) {
  events_to_observe_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* events_to_observe */:
        events_to_observe_.emplace_back();
        field.get(&events_to_observe_.back());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}